

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,io_context *io_context,uint16_t portNum,int nominalBufferSize)

{
  undefined8 in_RDI;
  io_context *unaff_retaddr;
  SocketFactory *in_stack_00000008;
  TcpServer *in_stack_00000010;
  SocketFactory local_38 [2];
  
  local_38[0].super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38[0].super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38[0].encrypted = false;
  local_38[0].handshake_server = false;
  local_38[0]._18_6_ = 0;
  SocketFactory::SocketFactory(local_38);
  TcpServer(in_stack_00000010,in_stack_00000008,unaff_retaddr,(uint16_t)((ulong)in_RDI >> 0x30),
            (int)in_RDI);
  SocketFactory::~SocketFactory((SocketFactory *)0x728c1c);
  return;
}

Assistant:

TcpServer::TcpServer(
    asio::io_context& io_context,
    uint16_t portNum,
    int nominalBufferSize) :
    TcpServer::TcpServer(
        SocketFactory(),
        io_context,
        portNum,
        nominalBufferSize)
{
}